

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRArgInfo * SoapySDRDevice_getSettingInfoWithKey(SoapySDRDevice *device,char *key)

{
  char *in_RDX;
  long *in_RSI;
  ArgInfo *in_RDI;
  exception *ex;
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [16];
  ArgInfo *in_stack_ffffffffffffff10;
  
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,in_RDX,&local_121);
  (**(code **)(*in_RSI + 0x328))(local_100,in_RSI,local_120);
  toArgInfo(in_stack_ffffffffffffff10);
  SoapySDR::ArgInfo::~ArgInfo(in_RDI);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return (SoapySDRArgInfo *)in_RDI;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getSettingInfoWithKey(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSettingInfo(key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfo())
}